

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoldMine.cpp
# Opt level: O2

void __thiscall GoldMine::GoldMine(GoldMine *this,string *n,int t,int spT)

{
  string sStack_48;
  
  std::__cxx11::string::string((string *)&sStack_48,(string *)n);
  Holding::Holding(&this->super_Holding,&sStack_48,t,spT,0xc,6);
  std::__cxx11::string::~string((string *)&sStack_48);
  (this->super_Holding).super_BlackCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_00116ba0;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)&this->name);
  this->cost = 0xc;
  this->tapped = false;
  this->revealed = false;
  this->harvestValue = 6;
  this->upperHolding = (Holding *)0x0;
  this->subHolding = (Holding *)0x0;
  return;
}

Assistant:

GoldMine::GoldMine(string n, int t, int spT) : Holding{n, t, spT, 12, 6}
{
    name = n;
    cost = 12;
    tapped = false;
    revealed = false;
    harvestValue = 6;

    upperHolding = nullptr;
    subHolding = nullptr;
}